

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleGestureEvent(QWidgetWindow *this,QNativeGestureEvent *e)

{
  long lVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QPoint *p;
  QPointF QVar3;
  QWidget *popupFocusWidget;
  QWidget *popup;
  QObject *receiver;
  QWidget *local_58;
  QWidget *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QWidget *)0x0;
  this_00 = QApplication::activePopupWidget();
  if (this_00 != (QWidget *)0x0) {
    pQVar2 = QWidget::focusWidget((QWidget *)0x3b726f);
    local_58 = this_00;
    if (pQVar2 != (QWidget *)0x0) {
      local_58 = pQVar2;
    }
    local_38 = local_58;
  }
  if (local_38 == (QWidget *)0x0) {
    QVar3 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b72ab);
    p = (QPoint *)QVar3.yp;
    QPointF::toPoint((QPointF *)this_00);
    local_38 = QApplication::widgetAt(p);
  }
  if (local_38 == (QWidget *)0x0) {
    local_38 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b72eb);
  }
  QCoreApplication::forwardEvent(&local_38->super_QObject,in_RSI,(QEvent *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleGestureEvent(QNativeGestureEvent *e)
{
    // copy-pasted code to find correct widget follows:
    QObject *receiver = nullptr;
    if (auto *popup = QApplication::activePopupWidget()) {
        QWidget *popupFocusWidget = popup->focusWidget();
        receiver = popupFocusWidget ? popupFocusWidget : popup;
    }
    if (!receiver)
        receiver = QApplication::widgetAt(e->globalPosition().toPoint());
    if (!receiver)
        receiver = m_widget; // last resort

    QApplication::forwardEvent(receiver, e);
}